

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int *piVar3;
  Layer *pLVar4;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  _func_int **pp_Var14;
  int iVar15;
  int iVar16;
  _func_int *p_Var17;
  uint _elempack;
  Option *opt_00;
  uint _w;
  int iVar18;
  int iVar19;
  uint _elempack_00;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  size_t _elemsize;
  int iVar23;
  uint uVar24;
  void *pvVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_248;
  ulong local_210;
  Mat local_1f8;
  Mat local_1a8;
  int local_15c;
  Mat local_158;
  void *local_108;
  int *local_100;
  ulong local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  _func_int ***local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  p_Var17 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0x10c + (long)p_Var17) != 0)) {
    iVar11 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar11;
  }
  uVar13 = bottom_blob->c;
  uVar22 = bottom_blob->elemsize;
  iVar11 = bottom_blob->elempack;
  opt_00 = (Option *)(long)iVar11;
  iVar16 = *(int *)(&this->field_0xd4 + (long)p_Var17);
  iVar23 = *(int *)(&this->field_0xdc + (long)p_Var17);
  iVar15 = *(int *)(&this->field_0xd8 + (long)p_Var17);
  iVar2 = *(int *)(&this->field_0xe0 + (long)p_Var17);
  local_1a8.cstep = 0;
  local_1a8.data = (Allocator *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1a8.elempack = 0;
  local_1a8.h = 0;
  local_1a8.allocator = (Allocator *)local_1a8.data;
  local_1a8.dims = (int)local_1a8.refcount;
  local_1a8.w = local_1a8.refcount._4_4_;
  local_1a8.d = (int)local_1a8.refcount;
  local_1a8.c = local_1a8.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_fma + (long)p_Var17),bottom_blob,
             &local_1a8,opt);
  iVar10 = local_1a8.w;
  iVar12 = -100;
  if (((Allocator *)local_1a8.data == (Allocator *)0x0) ||
     ((long)local_1a8.c * local_1a8.cstep == 0)) goto LAB_003e03fd;
  p_Var17 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar16 = (~((iVar16 + -1) * iVar23) + local_1a8.w) / *(int *)(&this->field_0xe4 + (long)p_Var17);
  _w = iVar16 + 1;
  iVar23 = (~((iVar15 + -1) * iVar2) + local_1a8.h) / *(int *)(&this->field_0xe8 + (long)p_Var17);
  uVar24 = *(uint *)(&this->field_0xd0 + (long)p_Var17);
  uVar20 = 1;
  if (opt->use_packing_layout == true) {
    uVar20 = 8;
    if ((uVar24 & 7) != 0) {
      uVar20 = (ulong)((uVar24 & 3) == 0) * 3 + 1;
    }
  }
  _elempack_00 = (uint)uVar20;
  _elemsize = (uVar22 / (ulong)opt_00) * uVar20;
  Mat::create(top_blob,_w,iVar23 + 1,(int)uVar24 / (int)_elempack_00,_elemsize,_elempack_00,
              opt->blob_allocator);
  iVar12 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003e03fd;
  iVar12 = iVar11 * uVar13;
  p_Var17 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var17);
  iVar2 = *(int *)(&this->field_0x108 + (long)p_Var17);
  if ((iVar12 == iVar2) && (iVar12 == iVar15)) {
    iVar15 = iVar12;
    if (iVar11 == 1) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var17) != 3) ||
         (*(int *)(&this->field_0xd8 + (long)p_Var17) != 3)) goto LAB_003df3e6;
      if ((*(int *)(&this->field_0xdc + (long)p_Var17) == 1) &&
         (((*(int *)(&this->field_0xe0 + (long)p_Var17) == 1 &&
           (*(int *)(&this->field_0xe4 + (long)p_Var17) == 1)) &&
          (*(int *)(&this->field_0xe8 + (long)p_Var17) == 1)))) {
        convdw3x3s1_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                        *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
      }
      else {
        if ((((*(int *)(&this->field_0xdc + (long)p_Var17) != 1) ||
             (*(int *)(&this->field_0xe0 + (long)p_Var17) != 1)) ||
            (*(int *)(&this->field_0xe4 + (long)p_Var17) != 2)) ||
           (*(int *)(&this->field_0xe8 + (long)p_Var17) != 2)) goto LAB_003df3e6;
        convdw3x3s2_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                        *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
      }
LAB_003e007c:
      pLVar4 = this->activation;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
      }
    }
    else {
      if (iVar11 == 4) {
        iVar11 = *(int *)(&this->field_0xd4 + (long)p_Var17);
        iVar15 = *(int *)(&this->field_0xd8 + (long)p_Var17);
        if (iVar11 == 5) {
          if (iVar15 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var17) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var17) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var17) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var17) == 1)))) {
              convdw5x5s1_pack4_sse
                        (&local_1a8,top_blob,&this->weight_data_tm,
                         *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
            }
            else {
              iVar15 = 5;
              if ((((*(int *)(&this->field_0xdc + (long)p_Var17) != 1) ||
                   (*(int *)(&this->field_0xe0 + (long)p_Var17) != 1)) ||
                  (*(int *)(&this->field_0xe4 + (long)p_Var17) != 2)) ||
                 (*(int *)(&this->field_0xe8 + (long)p_Var17) != 2)) goto LAB_003df966;
              convdw5x5s2_pack4_sse
                        (&local_1a8,top_blob,&this->weight_data_tm,
                         *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
            }
            goto LAB_003e007c;
          }
        }
        else if ((iVar11 == 3) && (iVar15 == 3)) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var17) == 1) &&
              ((*(int *)(&this->field_0xe0 + (long)p_Var17) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var17) == 1)))) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var17) == 1)) {
            convdw3x3s1_pack4_sse
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
          }
          else {
            iVar15 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var17) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var17) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var17) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var17) != 2)) goto LAB_003df966;
            convdw3x3s2_pack4_sse
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
          }
          goto LAB_003e007c;
        }
LAB_003df966:
        uVar24 = iVar15 * iVar11;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar24,
                   (allocator_type *)&local_1f8);
        pp_Var14 = this->_vptr_ConvolutionDepthWise_x86_fma;
        p_Var17 = pp_Var14[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var17)) {
          iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var17);
          iVar15 = *(int *)(&this->field_0xdc + (long)p_Var17);
          iVar2 = *(int *)(&this->field_0xd4 + (long)p_Var17);
          iVar12 = 0;
          iVar18 = 0;
          iVar19 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var17)) {
              lVar21 = 0;
              do {
                *(int *)((long)(_func_int ***)local_158.data + lVar21 * 4 + (long)iVar19 * 4) =
                     iVar18;
                p_Var17 = pp_Var14[-3];
                iVar18 = iVar18 + *(int *)(&this->field_0xdc + (long)p_Var17);
                lVar21 = lVar21 + 1;
              } while ((int)lVar21 < *(int *)(&this->field_0xd4 + (long)p_Var17));
              iVar19 = iVar19 + (int)lVar21;
            }
            iVar18 = iVar18 + (iVar10 * iVar11 - iVar15 * iVar2);
            iVar12 = iVar12 + 1;
          } while (iVar12 < *(int *)(&this->field_0xd8 + (long)p_Var17));
        }
        if (0 < (int)uVar13) {
          local_15c = uVar24 * 4;
          iVar11 = 0;
          auVar84 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar63._8_4_ = 0x3f000000;
          auVar63._0_8_ = 0x3f0000003f000000;
          auVar63._12_4_ = 0x3f000000;
          auVar33 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
          local_210 = 0;
          auVar90._8_4_ = 0x3ab743ce;
          auVar90._0_8_ = 0x3ab743ce3ab743ce;
          auVar90._12_4_ = 0x3ab743ce;
          auVar53._8_4_ = 0x3c088908;
          auVar53._0_8_ = 0x3c0889083c088908;
          auVar53._12_4_ = 0x3c088908;
          do {
            if (-1 < iVar23) {
              pvVar25 = (void *)(top_blob->cstep * local_210 * top_blob->elemsize +
                                (long)top_blob->data);
              pp_Var14 = this->_vptr_ConvolutionDepthWise_x86_fma;
              pvVar5 = (this->weight_data_tm).data;
              iVar15 = 0;
              do {
                if (-1 < iVar16) {
                  uVar22 = 0;
                  do {
                    p_Var17 = pp_Var14[-3];
                    if (*(int *)(&this->field_0x100 + (long)p_Var17) == 0) {
                      auVar67 = ZEXT816(0) << 0x40;
                    }
                    else {
                      auVar67 = *(undefined1 (*) [16])
                                 (*(long *)(&this->field_0x1b0 + (long)p_Var17) + local_210 * 0x10);
                    }
                    if (0 < (int)uVar24) {
                      lVar21 = 0;
                      do {
                        auVar67 = vfmadd231ps_fma(auVar67,*(undefined1 (*) [16])
                                                           ((long)pvVar5 +
                                                           lVar21 * 4 + (long)iVar11 * 4),
                                                  *(undefined1 (*) [16])
                                                   ((long)&((Allocator *)
                                                           ((long)local_1a8.data +
                                                           (long)*(int *)((long)(_func_int ***)
                                                                                local_158.data +
                                                                         lVar21) * 2 * 8))->
                                                           _vptr_Allocator +
                                                   (long)(*(int *)(&this->field_0xe4 + (long)p_Var17
                                                                  ) * (int)uVar22 * 4) * 4 +
                                                   (long)*(int *)(&this->field_0xe8 + (long)p_Var17)
                                                   * (long)iVar15 *
                                                   (long)local_1a8.w * local_1a8.elemsize +
                                                   local_1a8.cstep * local_210 * local_1a8.elemsize)
                                                 );
                        lVar21 = lVar21 + 4;
                      } while ((ulong)uVar24 << 2 != lVar21);
                    }
                    auVar35 = auVar84._0_16_;
                    auVar37 = auVar33._0_16_;
                    fVar6 = auVar33._0_4_;
                    fVar7 = auVar33._4_4_;
                    fVar8 = auVar33._8_4_;
                    fVar9 = auVar33._12_4_;
                    fVar69 = auVar67._4_4_;
                    fVar70 = auVar67._8_4_;
                    fVar71 = auVar67._12_4_;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var17)) {
                    case 1:
                      auVar67 = vmaxps_avx(auVar67,auVar35);
                      break;
                    case 2:
                      auVar37 = vmaxps_avx(auVar67,auVar35);
                      auVar67 = vminps_avx(auVar67,auVar35);
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var17);
                      auVar68._4_4_ = uVar1;
                      auVar68._0_4_ = uVar1;
                      auVar68._8_4_ = uVar1;
                      auVar68._12_4_ = uVar1;
                      auVar67 = vfmadd213ps_fma(auVar68,auVar67,auVar37);
                      break;
                    case 3:
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var17);
                      auVar37._4_4_ = uVar1;
                      auVar37._0_4_ = uVar1;
                      auVar37._8_4_ = uVar1;
                      auVar37._12_4_ = uVar1;
                      uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var17))[1];
                      auVar94._4_4_ = uVar1;
                      auVar94._0_4_ = uVar1;
                      auVar94._8_4_ = uVar1;
                      auVar94._12_4_ = uVar1;
                      auVar67 = vmaxps_avx(auVar67,auVar37);
                      auVar67 = vminps_avx(auVar94,auVar67);
                      break;
                    case 4:
                      auVar38._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
                      auVar38._8_4_ = -fVar70;
                      auVar38._12_4_ = -fVar71;
                      auVar47._8_4_ = 0x42b0c0a5;
                      auVar47._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar47._12_4_ = 0x42b0c0a5;
                      auVar67 = vminps_avx(auVar38,auVar47);
                      auVar48._8_4_ = 0xc2b0c0a5;
                      auVar48._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar48._12_4_ = 0xc2b0c0a5;
                      auVar81 = vmaxps_avx(auVar67,auVar48);
                      auVar65._8_4_ = 0x3fb8aa3b;
                      auVar65._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar65._12_4_ = 0x3fb8aa3b;
                      auVar67 = vfmadd213ps_fma(auVar65,auVar81,auVar63);
                      auVar95._0_4_ = (int)auVar67._0_4_;
                      auVar95._4_4_ = (int)auVar67._4_4_;
                      auVar95._8_4_ = (int)auVar67._8_4_;
                      auVar95._12_4_ = (int)auVar67._12_4_;
                      auVar35 = vcvtdq2ps_avx(auVar95);
                      auVar67 = vcmpps_avx(auVar67,auVar35,1);
                      auVar67 = vandps_avx(auVar67,auVar37);
                      auVar67 = vsubps_avx(auVar35,auVar67);
                      auVar29._8_4_ = 0x3f318000;
                      auVar29._0_8_ = 0x3f3180003f318000;
                      auVar29._12_4_ = 0x3f318000;
                      auVar35 = vfmsub231ps_fma(auVar81,auVar67,auVar29);
                      auVar49._8_4_ = 0x395e8083;
                      auVar49._0_8_ = 0x395e8083395e8083;
                      auVar49._12_4_ = 0x395e8083;
                      auVar81 = vfmsub231ps_fma(auVar35,auVar67,auVar49);
                      auVar96._0_4_ = auVar81._0_4_ * auVar81._0_4_;
                      auVar96._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                      auVar96._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                      auVar96._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                      auVar83._8_4_ = 0x39506967;
                      auVar83._0_8_ = 0x3950696739506967;
                      auVar83._12_4_ = 0x39506967;
                      auVar50._8_4_ = 0x3ab743ce;
                      auVar50._0_8_ = 0x3ab743ce3ab743ce;
                      auVar50._12_4_ = 0x3ab743ce;
                      auVar35 = vfmadd213ps_fma(auVar83,auVar81,auVar50);
                      auVar51._8_4_ = 0x3c088908;
                      auVar51._0_8_ = 0x3c0889083c088908;
                      auVar51._12_4_ = 0x3c088908;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar81,auVar51);
                      auVar30._8_4_ = 0x3d2aa9c1;
                      auVar30._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar30._12_4_ = 0x3d2aa9c1;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar81,auVar30);
                      auVar31._8_4_ = 0x3e2aaaaa;
                      auVar31._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar31._12_4_ = 0x3e2aaaaa;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar81,auVar31);
                      auVar35 = vfmadd213ps_fma(auVar35,auVar81,auVar63);
                      auVar35 = vfmadd213ps_fma(auVar35,auVar96,auVar81);
                      auVar39._0_4_ = auVar35._0_4_ + fVar6;
                      auVar39._4_4_ = auVar35._4_4_ + fVar7;
                      auVar39._8_4_ = auVar35._8_4_ + fVar8;
                      auVar39._12_4_ = auVar35._12_4_ + fVar9;
                      auVar84 = ZEXT864(0) << 0x20;
                      auVar66._0_4_ = (int)auVar67._0_4_;
                      auVar66._4_4_ = (int)auVar67._4_4_;
                      auVar66._8_4_ = (int)auVar67._8_4_;
                      auVar66._12_4_ = (int)auVar67._12_4_;
                      auVar67 = vpslld_avx(auVar66,0x17);
                      auVar67 = vpaddd_avx(auVar67,auVar37);
                      auVar35 = vfmadd213ps_fma(auVar67,auVar39,auVar37);
                      auVar67 = vrcpps_avx(auVar35);
                      auVar37 = vfmsub213ps_fma(auVar35,auVar67,auVar37);
                      auVar67 = vfnmadd132ps_fma(auVar37,auVar67,auVar67);
                      break;
                    case 5:
                      auVar85._8_4_ = 0x42b0c0a5;
                      auVar85._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar85._12_4_ = 0x42b0c0a5;
                      auVar35 = vminps_avx(auVar67,auVar85);
                      auVar87._8_4_ = 0xc2b0c0a5;
                      auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar87._12_4_ = 0xc2b0c0a5;
                      auVar52 = vmaxps_avx(auVar87,auVar35);
                      auVar89._8_4_ = 0x3fb8aa3b;
                      auVar89._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar89._12_4_ = 0x3fb8aa3b;
                      auVar35 = vfmadd213ps_fma(auVar89,auVar52,auVar63);
                      auVar91._0_4_ = (int)auVar35._0_4_;
                      auVar91._4_4_ = (int)auVar35._4_4_;
                      auVar91._8_4_ = (int)auVar35._8_4_;
                      auVar91._12_4_ = (int)auVar35._12_4_;
                      auVar81 = vcvtdq2ps_avx(auVar91);
                      auVar35 = vcmpps_avx(auVar35,auVar81,1);
                      auVar35 = vandps_avx(auVar35,auVar37);
                      auVar35 = vsubps_avx(auVar81,auVar35);
                      auVar86._8_4_ = 0x3f318000;
                      auVar86._0_8_ = 0x3f3180003f318000;
                      auVar86._12_4_ = 0x3f318000;
                      auVar81 = vfmsub231ps_fma(auVar52,auVar35,auVar86);
                      auVar88._8_4_ = 0xb95e8083;
                      auVar88._0_8_ = 0xb95e8083b95e8083;
                      auVar88._12_4_ = 0xb95e8083;
                      auVar52 = vfnmsub231ps_fma(auVar81,auVar35,auVar88);
                      auVar92._0_4_ = auVar52._0_4_ * auVar52._0_4_;
                      auVar92._4_4_ = auVar52._4_4_ * auVar52._4_4_;
                      auVar92._8_4_ = auVar52._8_4_ * auVar52._8_4_;
                      auVar92._12_4_ = auVar52._12_4_ * auVar52._12_4_;
                      auVar64._8_4_ = 0x39506967;
                      auVar64._0_8_ = 0x3950696739506967;
                      auVar64._12_4_ = 0x39506967;
                      auVar81 = vfmadd213ps_fma(auVar64,auVar52,auVar90);
                      auVar81 = vfmadd213ps_fma(auVar81,auVar52,auVar53);
                      auVar62._8_4_ = 0x3d2aa9c1;
                      auVar62._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar62._12_4_ = 0x3d2aa9c1;
                      auVar81 = vfmadd213ps_fma(auVar81,auVar52,auVar62);
                      auVar54._8_4_ = 0x3e2aaaaa;
                      auVar54._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar54._12_4_ = 0x3e2aaaaa;
                      auVar81 = vfmadd213ps_fma(auVar81,auVar52,auVar54);
                      auVar81 = vfmadd213ps_fma(auVar81,auVar52,auVar63);
                      auVar81 = vfmadd213ps_fma(auVar81,auVar92,auVar52);
                      auVar40._0_4_ = auVar81._0_4_ + fVar6;
                      auVar40._4_4_ = auVar81._4_4_ + fVar7;
                      auVar40._8_4_ = auVar81._8_4_ + fVar8;
                      auVar40._12_4_ = auVar81._12_4_ + fVar9;
                      auVar34._0_4_ = (int)auVar35._0_4_;
                      auVar34._4_4_ = (int)auVar35._4_4_;
                      auVar34._8_4_ = (int)auVar35._8_4_;
                      auVar34._12_4_ = (int)auVar35._12_4_;
                      auVar35 = vpslld_avx(auVar34,0x17);
                      auVar35 = vpaddd_avx(auVar35,auVar37);
                      auVar28 = vfmadd213ps_fma(auVar35,auVar40,auVar37);
                      auVar41._8_4_ = 0x800000;
                      auVar41._0_8_ = 0x80000000800000;
                      auVar41._12_4_ = 0x800000;
                      auVar35 = vmaxps_avx(auVar28,auVar41);
                      auVar81 = vpsrld_avx(auVar35,0x17);
                      auVar55._8_4_ = 0xffffff82;
                      auVar55._0_8_ = 0xffffff82ffffff82;
                      auVar55._12_4_ = 0xffffff82;
                      auVar81 = vpaddd_avx(auVar81,auVar55);
                      auVar56._8_4_ = 0x807fffff;
                      auVar56._0_8_ = 0x807fffff807fffff;
                      auVar56._12_4_ = 0x807fffff;
                      auVar35 = vandps_avx(auVar35,auVar56);
                      auVar27 = vorps_avx(auVar35,auVar63);
                      auVar52 = vcvtdq2ps_avx(auVar81);
                      auVar57._8_4_ = 0x3f3504f3;
                      auVar57._0_8_ = 0x3f3504f33f3504f3;
                      auVar57._12_4_ = 0x3f3504f3;
                      auVar81 = vcmpps_avx(auVar27,auVar57,1);
                      auVar35 = vandps_avx(auVar81,auVar27);
                      auVar42._0_4_ = auVar27._0_4_ + -1.0 + auVar35._0_4_;
                      auVar42._4_4_ = auVar27._4_4_ + -1.0 + auVar35._4_4_;
                      auVar42._8_4_ = auVar27._8_4_ + -1.0 + auVar35._8_4_;
                      auVar42._12_4_ = auVar27._12_4_ + -1.0 + auVar35._12_4_;
                      auVar35 = vandps_avx(auVar81,auVar37);
                      auVar81 = vsubps_avx(auVar52,auVar35);
                      auVar82._0_4_ = auVar42._0_4_ * auVar42._0_4_;
                      auVar82._4_4_ = auVar42._4_4_ * auVar42._4_4_;
                      auVar82._8_4_ = auVar42._8_4_ * auVar42._8_4_;
                      auVar82._12_4_ = auVar42._12_4_ * auVar42._12_4_;
                      auVar93._8_4_ = 0x3d9021bb;
                      auVar93._0_8_ = 0x3d9021bb3d9021bb;
                      auVar93._12_4_ = 0x3d9021bb;
                      auVar72._8_4_ = 0xbdebd1b8;
                      auVar72._0_8_ = 0xbdebd1b8bdebd1b8;
                      auVar72._12_4_ = 0xbdebd1b8;
                      auVar35 = vfmadd213ps_fma(auVar93,auVar42,auVar72);
                      auVar73._8_4_ = 0x3def251a;
                      auVar73._0_8_ = 0x3def251a3def251a;
                      auVar73._12_4_ = 0x3def251a;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar42,auVar73);
                      auVar74._8_4_ = 0xbdfe5d4f;
                      auVar74._0_8_ = 0xbdfe5d4fbdfe5d4f;
                      auVar74._12_4_ = 0xbdfe5d4f;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar42,auVar74);
                      auVar75._8_4_ = 0x3e11e9bf;
                      auVar75._0_8_ = 0x3e11e9bf3e11e9bf;
                      auVar75._12_4_ = 0x3e11e9bf;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar42,auVar75);
                      auVar76._8_4_ = 0xbe2aae50;
                      auVar76._0_8_ = 0xbe2aae50be2aae50;
                      auVar76._12_4_ = 0xbe2aae50;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar42,auVar76);
                      auVar77._8_4_ = 0x3e4cceac;
                      auVar77._0_8_ = 0x3e4cceac3e4cceac;
                      auVar77._12_4_ = 0x3e4cceac;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar42,auVar77);
                      auVar78._8_4_ = 0xbe7ffffc;
                      auVar78._0_8_ = 0xbe7ffffcbe7ffffc;
                      auVar78._12_4_ = 0xbe7ffffc;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar42,auVar78);
                      auVar79._8_4_ = 0x3eaaaaaa;
                      auVar79._0_8_ = 0x3eaaaaaa3eaaaaaa;
                      auVar79._12_4_ = 0x3eaaaaaa;
                      auVar35 = vfmadd213ps_fma(auVar35,auVar42,auVar79);
                      auVar80._0_4_ = auVar82._0_4_ * auVar42._0_4_ * auVar35._0_4_;
                      auVar80._4_4_ = auVar82._4_4_ * auVar42._4_4_ * auVar35._4_4_;
                      auVar80._8_4_ = auVar82._8_4_ * auVar42._8_4_ * auVar35._8_4_;
                      auVar80._12_4_ = auVar82._12_4_ * auVar42._12_4_ * auVar35._12_4_;
                      auVar35 = vfmadd231ps_fma(auVar80,auVar81,auVar88);
                      auVar52 = vfmsub231ps_fma(auVar35,auVar63,auVar82);
                      auVar35._12_4_ = 0;
                      auVar35._0_12_ = ZEXT412(0);
                      auVar84 = ZEXT1264(ZEXT412(0)) << 0x20;
                      auVar35 = vcmpps_avx(auVar28,auVar35 << 0x20,2);
                      auVar52 = vsubps_avx(auVar52,auVar42);
                      auVar81 = vfnmadd231ps_fma(auVar52,auVar86,auVar81);
                      auVar43._0_4_ = auVar81._0_4_ + auVar81._0_4_;
                      auVar43._4_4_ = auVar81._4_4_ + auVar81._4_4_;
                      auVar43._8_4_ = auVar81._8_4_ + auVar81._8_4_;
                      auVar43._12_4_ = auVar81._12_4_ + auVar81._12_4_;
                      auVar58._8_4_ = 0x7fffffff;
                      auVar58._0_8_ = 0x7fffffff7fffffff;
                      auVar58._12_4_ = 0x7fffffff;
                      auVar35 = vblendvps_avx(auVar43,auVar58,auVar35);
                      auVar44._8_4_ = 0x42b0c0a5;
                      auVar44._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar44._12_4_ = 0x42b0c0a5;
                      auVar35 = vminps_avx(auVar35,auVar44);
                      auVar45._8_4_ = 0xc2b0c0a5;
                      auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar45._12_4_ = 0xc2b0c0a5;
                      auVar52 = vmaxps_avx(auVar35,auVar45);
                      auVar35 = vfmadd213ps_fma(auVar89,auVar52,auVar63);
                      auVar59._0_4_ = (int)auVar35._0_4_;
                      auVar59._4_4_ = (int)auVar35._4_4_;
                      auVar59._8_4_ = (int)auVar35._8_4_;
                      auVar59._12_4_ = (int)auVar35._12_4_;
                      auVar81 = vcvtdq2ps_avx(auVar59);
                      auVar35 = vcmpps_avx(auVar35,auVar81,1);
                      auVar35 = vandps_avx(auVar35,auVar37);
                      auVar35 = vsubps_avx(auVar81,auVar35);
                      auVar81 = vfmsub231ps_fma(auVar52,auVar35,auVar86);
                      auVar52 = vfnmsub231ps_fma(auVar81,auVar35,auVar88);
                      auVar60._0_4_ = auVar52._0_4_ * auVar52._0_4_;
                      auVar60._4_4_ = auVar52._4_4_ * auVar52._4_4_;
                      auVar60._8_4_ = auVar52._8_4_ * auVar52._8_4_;
                      auVar60._12_4_ = auVar52._12_4_ * auVar52._12_4_;
                      auVar81 = vfmadd213ps_fma(auVar64,auVar52,auVar90);
                      auVar81 = vfmadd213ps_fma(auVar81,auVar52,auVar53);
                      auVar81 = vfmadd213ps_fma(auVar81,auVar52,auVar62);
                      auVar33 = ZEXT1664(auVar37);
                      auVar27._8_4_ = 0x3e2aaaaa;
                      auVar27._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar27._12_4_ = 0x3e2aaaaa;
                      auVar81 = vfmadd213ps_fma(auVar81,auVar52,auVar27);
                      auVar81 = vfmadd213ps_fma(auVar81,auVar52,auVar63);
                      auVar81 = vfmadd213ps_fma(auVar81,auVar60,auVar52);
                      auVar36._0_4_ = auVar81._0_4_ + fVar6;
                      auVar36._4_4_ = auVar81._4_4_ + fVar7;
                      auVar36._8_4_ = auVar81._8_4_ + fVar8;
                      auVar36._12_4_ = auVar81._12_4_ + fVar9;
                      auVar46._0_4_ = (int)auVar35._0_4_;
                      auVar46._4_4_ = (int)auVar35._4_4_;
                      auVar46._8_4_ = (int)auVar35._8_4_;
                      auVar46._12_4_ = (int)auVar35._12_4_;
                      auVar35 = vpslld_avx(auVar46,0x17);
                      auVar35 = vpaddd_avx(auVar35,auVar37);
                      auVar35 = vfmadd213ps_fma(auVar35,auVar36,auVar37);
                      auVar37 = vrcpps_avx(auVar35);
                      auVar61._0_4_ = auVar37._0_4_ + auVar37._0_4_;
                      auVar61._4_4_ = auVar37._4_4_ + auVar37._4_4_;
                      auVar61._8_4_ = auVar37._8_4_ + auVar37._8_4_;
                      auVar61._12_4_ = auVar37._12_4_ + auVar37._12_4_;
                      auVar28._8_4_ = 0x40000000;
                      auVar28._0_8_ = 0x4000000040000000;
                      auVar28._12_4_ = 0x40000000;
                      auVar35 = vfmsub213ps_fma(auVar35,auVar61,auVar28);
                      auVar37 = vfnmadd213ps_fma(auVar35,auVar37,auVar61);
                      auVar67 = vfmsub231ps_fma(auVar67,auVar67,auVar37);
                      break;
                    case 6:
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var17);
                      auVar81._4_4_ = uVar1;
                      auVar81._0_4_ = uVar1;
                      auVar81._8_4_ = uVar1;
                      auVar81._12_4_ = uVar1;
                      uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var17))[1];
                      auVar52._4_4_ = uVar1;
                      auVar52._0_4_ = uVar1;
                      auVar52._8_4_ = uVar1;
                      auVar52._12_4_ = uVar1;
                      auVar81 = vfmadd231ps_fma(auVar52,auVar67,auVar81);
                      auVar35 = vmaxps_avx(auVar35,auVar81);
                      auVar37 = vminps_avx(auVar35,auVar37);
                      auVar67._0_4_ = auVar67._0_4_ * auVar37._0_4_;
                      auVar67._4_4_ = fVar69 * auVar37._4_4_;
                      auVar67._8_4_ = fVar70 * auVar37._8_4_;
                      auVar67._12_4_ = fVar71 * auVar37._12_4_;
                    }
                    *(undefined1 (*) [16])((long)pvVar25 + uVar22 * 0x10) = auVar67;
                    uVar22 = uVar22 + 1;
                  } while (uVar22 != _w);
                }
                pvVar25 = (void *)((long)pvVar25 + (long)(int)(_w * 4) * 4);
                bVar26 = iVar15 != iVar23;
                iVar15 = iVar15 + 1;
              } while (bVar26);
            }
            local_210 = local_210 + 1;
            iVar11 = iVar11 + local_15c;
          } while (local_210 != uVar13);
        }
      }
      else {
        if (iVar11 != 8) goto LAB_003df3e6;
        iVar11 = *(int *)(&this->field_0xd4 + (long)p_Var17);
        iVar15 = *(int *)(&this->field_0xd8 + (long)p_Var17);
        if (iVar11 == 5) {
          if (iVar15 == 5) {
            if (((*(int *)(&this->field_0xdc + (long)p_Var17) == 1) &&
                (*(int *)(&this->field_0xe0 + (long)p_Var17) == 1)) &&
               ((*(int *)(&this->field_0xe4 + (long)p_Var17) == 1 &&
                (*(int *)(&this->field_0xe8 + (long)p_Var17) == 1)))) {
              convdw5x5s1_pack8_avx
                        (&local_1a8,top_blob,&this->weight_data_tm,
                         *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
            }
            else {
              iVar15 = 5;
              if (((*(int *)(&this->field_0xdc + (long)p_Var17) != 1) ||
                  (*(int *)(&this->field_0xe0 + (long)p_Var17) != 1)) ||
                 ((*(int *)(&this->field_0xe4 + (long)p_Var17) != 2 ||
                  (*(int *)(&this->field_0xe8 + (long)p_Var17) != 2)))) goto LAB_003e009a;
              convdw5x5s2_pack8_avx
                        (&local_1a8,top_blob,&this->weight_data_tm,
                         *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
            }
            goto LAB_003e007c;
          }
        }
        else if ((iVar11 == 3) && (iVar15 == 3)) {
          if ((*(int *)(&this->field_0xdc + (long)p_Var17) == 1) &&
             (((*(int *)(&this->field_0xe0 + (long)p_Var17) == 1 &&
               (*(int *)(&this->field_0xe4 + (long)p_Var17) == 1)) &&
              (*(int *)(&this->field_0xe8 + (long)p_Var17) == 1)))) {
            convdw3x3s1_pack8_avx
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
          }
          else {
            iVar15 = 3;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var17) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var17) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var17) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var17) != 2)) goto LAB_003e009a;
            convdw3x3s2_pack8_avx
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var17),opt_00);
          }
          goto LAB_003e007c;
        }
LAB_003e009a:
        uVar24 = iVar15 * iVar11;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar24,
                   (allocator_type *)&local_1f8);
        pp_Var14 = this->_vptr_ConvolutionDepthWise_x86_fma;
        p_Var17 = pp_Var14[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var17)) {
          iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var17);
          iVar15 = *(int *)(&this->field_0xdc + (long)p_Var17);
          iVar2 = *(int *)(&this->field_0xd4 + (long)p_Var17);
          iVar12 = 0;
          iVar18 = 0;
          iVar19 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var17)) {
              lVar21 = 0;
              do {
                *(int *)((long)(_func_int ***)local_158.data + lVar21 * 4 + (long)iVar12 * 4) =
                     iVar18;
                p_Var17 = pp_Var14[-3];
                iVar18 = iVar18 + *(int *)(&this->field_0xdc + (long)p_Var17);
                lVar21 = lVar21 + 1;
              } while ((int)lVar21 < *(int *)(&this->field_0xd4 + (long)p_Var17));
              iVar12 = iVar12 + (int)lVar21;
            }
            iVar18 = iVar18 + (iVar10 * iVar11 - iVar15 * iVar2);
            iVar19 = iVar19 + 1;
          } while (iVar19 < *(int *)(&this->field_0xd8 + (long)p_Var17));
        }
        if (0 < (int)uVar13) {
          iVar11 = 0;
          local_248 = 0;
          do {
            if (-1 < iVar23) {
              pvVar25 = (void *)(top_blob->cstep * local_248 * top_blob->elemsize +
                                (long)top_blob->data);
              pp_Var14 = this->_vptr_ConvolutionDepthWise_x86_fma;
              pvVar5 = (this->weight_data_tm).data;
              iVar15 = 0;
              do {
                if (-1 < iVar16) {
                  uVar22 = 0;
                  do {
                    p_Var17 = pp_Var14[-3];
                    if (*(int *)(&this->field_0x100 + (long)p_Var17) == 0) {
                      auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    else {
                      auVar33 = ZEXT3264(*(undefined1 (*) [32])
                                          (*(long *)(&this->field_0x1b0 + (long)p_Var17) +
                                          local_248 * 0x20));
                    }
                    auVar32 = auVar33._0_32_;
                    if (0 < (int)uVar24) {
                      lVar21 = 0;
                      do {
                        auVar53 = vfmadd231ps_fma(auVar33._0_32_,
                                                  *(undefined1 (*) [32])
                                                   ((long)&((Allocator *)
                                                           ((long)local_1a8.data +
                                                           (long)*(int *)((long)(_func_int ***)
                                                                                local_158.data +
                                                                         lVar21) * 4 * 8))->
                                                           _vptr_Allocator +
                                                   (long)(*(int *)(&this->field_0xe4 + (long)p_Var17
                                                                  ) * (int)uVar22 * 8) * 4 +
                                                   (long)*(int *)(&this->field_0xe8 + (long)p_Var17)
                                                   * (long)iVar15 *
                                                   (long)local_1a8.w * local_1a8.elemsize +
                                                   local_1a8.cstep * local_248 * local_1a8.elemsize)
                                                  ,*(undefined1 (*) [32])
                                                    ((long)pvVar5 + lVar21 * 8 + (long)iVar11 * 4));
                        auVar33 = ZEXT1664(auVar53);
                        auVar32 = ZEXT1632(auVar53);
                        lVar21 = lVar21 + 4;
                      } while ((ulong)uVar24 << 2 != lVar21);
                    }
                    *(undefined1 (*) [32])((long)pvVar25 + uVar22 * 0x20) = auVar32;
                    uVar22 = uVar22 + 1;
                  } while (uVar22 != _w);
                }
                pvVar25 = (void *)((long)pvVar25 + (long)(int)(_w * 8) * 4);
                bVar26 = iVar15 != iVar23;
                iVar15 = iVar15 + 1;
              } while (bVar26);
            }
            local_248 = local_248 + 1;
            iVar11 = iVar11 + uVar24 * 8;
          } while (local_248 != uVar13);
        }
        pLVar4 = this->activation;
        if (pLVar4 != (Layer *)0x0) {
          (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
        }
      }
      if ((Allocator *)local_158.data != (Allocator *)0x0) {
        operator_delete(local_158.data,local_158.elemsize - (long)local_158.data);
      }
    }
    iVar12 = 0;
    goto LAB_003e03fd;
  }
LAB_003df3e6:
  uVar13 = iVar12 / iVar2;
  uVar24 = iVar15 / iVar2;
  iVar16 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar16 = (uint)((uVar13 & 3) == 0) * 3 + 1;
    if ((uVar13 & 7) == 0) {
      iVar16 = 8;
    }
    _elempack = (uint)((uVar24 & 3) == 0) * 3 + 1;
    if ((uVar24 & 7) == 0) {
      _elempack = 8;
    }
  }
  piVar3 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  local_158.refcount = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  local_158.data = local_1a8.data;
  local_158.elemsize = local_1a8.elemsize;
  local_158.elempack = local_1a8.elempack;
  local_158.allocator = local_1a8.allocator;
  local_158.w = local_1a8.w;
  local_158.dims = local_1a8.dims;
  local_158.d = local_1a8.d;
  local_158.h = local_1a8.h;
  local_158.c = local_1a8.c;
  local_158.cstep = local_1a8.cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (iVar16 < iVar11) {
    local_1f8.data = *(void **)opt;
    local_1f8.elemsize = (size_t)opt->workspace_allocator;
    local_1f8.elempack = opt->openmp_blocktime;
    local_1f8._28_1_ = opt->use_winograd_convolution;
    local_1f8._29_1_ = opt->use_sgemm_convolution;
    local_1f8._30_1_ = opt->use_int8_inference;
    local_1f8._31_1_ = opt->use_vulkan_compute;
    local_1f8.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_1f8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_1f8._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_1f8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
    local_1f8.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_1a8,&local_158,iVar16,(Option *)&local_1f8);
  }
  piVar3 = top_blob->refcount;
  local_1f8.data = top_blob->data;
  local_1f8.refcount = top_blob->refcount;
  local_1f8.elemsize = top_blob->elemsize;
  local_1f8.elempack = top_blob->elempack;
  local_1f8.allocator = top_blob->allocator;
  local_1f8.dims = top_blob->dims;
  local_1f8.w = top_blob->w;
  local_1f8.h = top_blob->h;
  local_1f8.d = top_blob->d;
  local_1f8.c = top_blob->c;
  local_1f8.cstep = top_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  pp_Var14 = this->_vptr_ConvolutionDepthWise_x86_fma;
  if (_elempack < _elempack_00) {
    Mat::create(&local_1f8,_w,iVar23 + 1,
                *(int *)(&this->field_0xd0 + (long)pp_Var14[-3]) / (int)_elempack,
                (ulong)_elempack * (_elemsize / uVar20),_elempack,opt->workspace_allocator);
    iVar12 = -100;
    if ((local_1f8.data != (void *)0x0) && ((long)local_1f8.c * local_1f8.cstep != 0)) {
      pp_Var14 = this->_vptr_ConvolutionDepthWise_x86_fma;
      goto LAB_003df5dd;
    }
  }
  else {
LAB_003df5dd:
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var14[-3])) {
      iVar23 = 0;
      iVar11 = 0;
      lVar21 = 0;
      do {
        local_c0 = (_func_int ***)
                   ((long)(_func_int ***)local_158.data +
                   (long)(iVar23 / iVar16) * local_158.cstep * local_158.elemsize);
        local_b8 = (int *)0x0;
        local_b0 = local_158.elemsize;
        local_a8 = local_158.elempack;
        local_a0 = local_158.allocator;
        local_80 = ((long)local_158.d * local_158.elemsize * (long)local_158.h * (long)local_158.w +
                    0xf & 0xfffffffffffffff0) / local_158.elemsize;
        local_98 = local_158.dims;
        iStack_94 = local_158.w;
        iStack_90 = local_158.h;
        iStack_8c = local_158.d;
        local_108 = (void *)((long)(iVar11 / (int)_elempack) * local_1f8.cstep * local_1f8.elemsize
                            + (long)local_1f8.data);
        local_100 = (int *)0x0;
        local_f8 = local_1f8.elemsize;
        local_f0 = local_1f8.elempack;
        local_e8 = local_1f8.allocator;
        local_c8 = ((long)local_1f8.d * local_1f8.elemsize * (long)local_1f8.h * (long)local_1f8.w +
                    0xf & 0xfffffffffffffff0) / local_1f8.elemsize;
        local_e0 = local_1f8.dims;
        iStack_dc = local_1f8.w;
        iStack_d8 = local_1f8.h;
        iStack_d4 = local_1f8.d;
        pLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar21];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_shader_local_memory;
        uStack_48._6_1_ = opt->use_cooperative_matrix;
        uStack_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = local_1f8.allocator;
        local_d0 = (int)uVar24 / (int)_elempack;
        local_88 = (int)uVar13 / iVar16;
        (*pLVar4->_vptr_Layer[7])(pLVar4,&local_c0,&local_108);
        if (local_100 != (int *)0x0) {
          LOCK();
          *local_100 = *local_100 + -1;
          UNLOCK();
          if (*local_100 == 0) {
            if (local_e8 == (Allocator *)0x0) {
              if (local_108 != (void *)0x0) {
                free(local_108);
              }
            }
            else {
              (*local_e8->_vptr_Allocator[3])();
            }
          }
        }
        if (local_b8 != (int *)0x0) {
          LOCK();
          *local_b8 = *local_b8 + -1;
          UNLOCK();
          if (*local_b8 == 0) {
            if (local_a0 == (Allocator *)0x0) {
              if (local_c0 != (_func_int ***)0x0) {
                free(local_c0);
              }
            }
            else {
              (*local_a0->_vptr_Allocator[3])();
            }
          }
        }
        lVar21 = lVar21 + 1;
        iVar11 = iVar11 + uVar24;
        iVar23 = iVar23 + uVar13;
      } while (lVar21 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
    }
    if (_elempack < _elempack_00) {
      convert_packing(&local_1f8,top_blob,_elempack_00,opt);
      iVar12 = 0;
    }
    else {
      iVar12 = 0;
      if (&local_1f8 != top_blob) {
        if (local_1f8.refcount != (int *)0x0) {
          LOCK();
          *local_1f8.refcount = *local_1f8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar12 = 0;
        top_blob->data = local_1f8.data;
        top_blob->refcount = local_1f8.refcount;
        top_blob->elemsize = local_1f8.elemsize;
        top_blob->elempack = local_1f8.elempack;
        top_blob->allocator = local_1f8.allocator;
        top_blob->dims = local_1f8.dims;
        top_blob->w = local_1f8.w;
        top_blob->h = local_1f8.h;
        top_blob->d = local_1f8.d;
        top_blob->c = local_1f8.c;
        top_blob->cstep = local_1f8.cstep;
      }
    }
  }
  if (local_1f8.refcount != (int *)0x0) {
    LOCK();
    *local_1f8.refcount = *local_1f8.refcount + -1;
    UNLOCK();
    if (*local_1f8.refcount == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if (local_1f8.data != (void *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_158.refcount != (int *)0x0) {
    LOCK();
    *local_158.refcount = *local_158.refcount + -1;
    UNLOCK();
    if (*local_158.refcount == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_158.data != (Allocator *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003e03fd:
  piVar3 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar12;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}